

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialModule.cpp
# Opt level: O1

void __thiscall module::SequentialModule::~SequentialModule(SequentialModule *this)

{
  pointer ppLVar1;
  ulong uVar2;
  
  this->_vptr_SequentialModule = (_func_int **)&PTR__SequentialModule_00108d38;
  if (this->_in != (tensor)0x0) {
    type::destroyTensor(this->_in);
  }
  ppLVar1 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppLVar1) {
    uVar2 = 0;
    do {
      if (ppLVar1[uVar2] != (Layer *)0x0) {
        (*ppLVar1[uVar2]->_vptr_Layer[1])();
      }
      uVar2 = uVar2 + 1;
      ppLVar1 = (this->_lLayers).super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->_lLayers).
                                   super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3))
    ;
  }
  if (ppLVar1 != (pointer)0x0) {
    operator_delete(ppLVar1,(long)(this->_lLayers).
                                  super__Vector_base<layer::Layer_*,_std::allocator<layer::Layer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar1
                   );
    return;
  }
  return;
}

Assistant:

SequentialModule::~SequentialModule()
    {
        if(_in != nullptr) type::destroyTensor(_in);

        for(int i(0); i < _lLayers.size(); i++)
            delete _lLayers[i];
    }